

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1050::run(TestCase1050 *this)

{
  anon_class_8_1_7c961949 local_20;
  size_t local_18;
  size_t stackSize;
  TestCase1050 *this_local;
  
  stackSize = (size_t)this;
  local_20.stackSize = getSmallStackSize();
  local_18 = local_20.stackSize;
  (anonymous_namespace)::runWithStackLimit<kj::(anonymous_namespace)::TestCase1050::run()::__0>
            (local_20.stackSize,&local_20);
  return;
}

Assistant:

TEST(Async, LargeTaskSetDestruction) {
  size_t stackSize = getSmallStackSize();

  runWithStackLimit(stackSize, [stackSize]() {
    ErrorHandlerImpl errorHandler;
    TaskSet tasks(errorHandler);

    for (int i = 0; i < stackSize / sizeof(void*); i++) {
      tasks.add(kj::NEVER_DONE);
    }
  });
}